

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_stream_amend.c
# Opt level: O0

MPP_RET hal_h265e_amend_temporal_id(HalEncTask *enc_task,RK_U32 strm_size)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  RK_U8 *stream_ptr;
  RK_U32 offset;
  H265eSyntax_new *syn;
  MPP_RET ret;
  RK_U32 strm_size_local;
  HalEncTask *enc_task_local;
  
  pvVar1 = (enc_task->syntax).data;
  sVar2 = mpp_packet_get_length(enc_task->packet);
  pvVar3 = mpp_buffer_get_ptr_with_caller(enc_task->output,"hal_h265e_amend_temporal_id");
  if (strm_size < 5) {
    _mpp_log_l(2,(char *)0x0,"Stream size is too small, maybe there is hw encoder error!",
               (char *)0x0);
    enc_task_local._4_4_ = MPP_NOK;
  }
  else {
    if (*(int *)((long)pvVar1 + 0x124) != 0) {
      *(byte *)((long)pvVar3 + (sVar2 & 0xffffffff) + 5) =
           *(byte *)((long)pvVar3 + (sVar2 & 0xffffffff) + 5) & 0xf8 |
           (char)*(undefined4 *)((long)pvVar1 + 0x124) + 1U & 7;
    }
    enc_task_local._4_4_ = MPP_OK;
  }
  return enc_task_local._4_4_;
}

Assistant:

MPP_RET hal_h265e_amend_temporal_id(HalEncTask *enc_task, RK_U32 strm_size)
{
    MPP_RET ret = MPP_OK;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);
    RK_U8 *stream_ptr = (RK_U8 *)(mpp_buffer_get_ptr(enc_task->output) + offset);

    if (strm_size < 5) {
        mpp_err("Stream size is too small, maybe there is hw encoder error!");
        return MPP_NOK;
    }

    if (syn->sp.temporal_id)
        stream_ptr[5] = (stream_ptr[5] & 0xf8) | ((syn->sp.temporal_id + 1) & 0x7);

    return ret;
}